

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_handler.cc
# Opt level: O1

size_t __thiscall
helix::parity::pmd_handler::process_packet(pmd_handler *this,packet_view *packet,bool sync)

{
  byte bVar1;
  uint uVar2;
  pmd_order_added *m;
  size_t sVar3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  m = (pmd_order_added *)packet->_buf;
  bVar1 = m->MessageType;
  if (bVar1 < 0x53) {
    switch(bVar1) {
    case 0x41:
      process_msg(this,m,sync);
      sVar3 = 0x1e;
      break;
    case 0x42:
      sVar3 = 9;
      break;
    default:
switchD_0011a168_caseD_43:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
      std::operator+(&local_40,"unknown type: ",&local_60);
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      *(undefined ***)this_00 = &PTR__runtime_error_00122b90;
      __cxa_throw(this_00,&unknown_message_type::typeinfo,std::runtime_error::~runtime_error);
    case 0x44:
      process_msg(this,(pmd_order_deleted *)m,sync);
      sVar3 = 0xd;
      break;
    case 0x45:
      process_msg(this,(pmd_order_executed *)m,sync);
      sVar3 = 0x15;
    }
  }
  else if (bVar1 == 0x58) {
    process_msg(this,(pmd_order_canceled *)m,sync);
    sVar3 = 0x11;
  }
  else {
    sVar3 = 5;
    if (bVar1 != 0x56) {
      if (bVar1 != 0x53) goto switchD_0011a168_caseD_43;
      uVar2 = m->Timestamp;
      this->_seconds =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
  }
  return sVar3;
}

Assistant:

void pmd_handler::subscribe(std::string sym, size_t max_orders)
{
    helix::order_book ob{sym, 0, max_orders};
    ob.set_state(trading_state::trading);
    auto padding = PMD_INSTRUMENT_LEN - sym.size();
    if (padding > 0) {
        sym.insert(sym.size(), padding, ' ');
    }
    _symbols.insert(sym);
    _order_book_id_map.emplace(sym, std::move(ob));
}